

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::
GetPropertyFromDescriptor<false,JsUtil::CharacterBuffer<char16_t>>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          Var originalInstance,DictionaryPropertyDescriptor<unsigned_short> *descriptor,Var *value,
          PropertyValueInfo *info,CharacterBuffer<char16_t> *propertyT,ScriptContext *requestContext
          )

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  unsigned_short uVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *pRVar7;
  JavascriptLibrary *this_00;
  byte bVar8;
  RecyclableObject *func;
  unsigned_short dataSlot;
  bool isLetConstGlobal;
  PropertyValueInfo *info_local;
  Var *value_local;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor_local;
  Var originalInstance_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  if ((descriptor->Attributes & 0x10) != 0) {
    bVar3 = VarIs<Js::RootObjectBase,Js::DynamicObject>(instance);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x202,"(!isLetConstGlobal || VarIs<RootObjectBase>(instance))",
                                  "object must be a global object if letconstglobal is set");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  bVar1 = descriptor->Attributes;
  bVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetIsShadowed(descriptor);
  bVar8 = 0x10;
  if (bVar3) {
    bVar8 = 0;
  }
  if ((bVar1 & (bVar8 | 8)) == 0) {
    uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(descriptor);
    if (uVar4 == 0xffff) {
      uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(descriptor);
      if (uVar4 == 0xffff) {
        this_00 = RecyclableObject::GetLibrary(&instance->super_RecyclableObject);
        pRVar7 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
        *value = pRVar7;
        this_local._4_4_ = 1;
      }
      else {
        uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(descriptor);
        SetPropertyValueInfoNonFixed
                  (this,info,&instance->super_RecyclableObject,uVar4,descriptor->Attributes,
                   InlineCacheNoFlags);
        CacheOperators::CachePropertyReadForGetter(info,originalInstance,propertyT,requestContext);
        PropertyValueInfo::SetNoCache(info,&instance->super_RecyclableObject);
        uVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetGetterPropertyIndex(descriptor);
        pvVar6 = DynamicObject::GetSlot(instance,(uint)uVar4);
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
        pvVar6 = Js::JavascriptOperators::CallGetter(pRVar7,originalInstance,requestContext);
        *value = pvVar6;
        this_local._4_4_ = 1;
      }
    }
    else {
      pvVar6 = DynamicObject::GetSlot(instance,(uint)uVar4);
      *value = pvVar6;
      SetPropertyValueInfo(this,info,&instance->super_RecyclableObject,uVar4,descriptor);
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::GetPropertyFromDescriptor(DynamicObject* instance, Var originalInstance,
        DictionaryPropertyDescriptor<T>* descriptor, Var* value, PropertyValueInfo* info, PropertyType propertyT, ScriptContext* requestContext)
    {
        bool const isLetConstGlobal = (descriptor->Attributes & PropertyLetConstGlobal) != 0;
        AssertMsg(!isLetConstGlobal || VarIs<RootObjectBase>(instance), "object must be a global object if letconstglobal is set");
        if (allowLetConstGlobal)
        {
            // GetRootProperty: false if not global
            if (!(descriptor->Attributes & PropertyLetConstGlobal) && (descriptor->Attributes & PropertyDeleted))
            {
                return false;
            }
        }
        else
        {
            // GetProperty: don't count deleted or global.
            if (descriptor->Attributes & (PropertyDeleted | (descriptor->GetIsShadowed() ? 0 : PropertyLetConstGlobal)))
            {
                return false;
            }
        }

        T dataSlot = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlot != NoSlots)
        {
            *value = instance->GetSlot(dataSlot);
            SetPropertyValueInfo(info, instance, dataSlot, descriptor);
        }
        else if (descriptor->GetGetterPropertyIndex() != NoSlots)
        {
            // We must update cache before calling a getter, because it can invalidate something. Bug# 593815
            SetPropertyValueInfoNonFixed(info, instance, descriptor->GetGetterPropertyIndex(), descriptor->Attributes);
            CacheOperators::CachePropertyReadForGetter(info, originalInstance, propertyT, requestContext);
            PropertyValueInfo::SetNoCache(info, instance); // we already cached getter, so we don't have to do it once more

            RecyclableObject* func = UnsafeVarTo<RecyclableObject>(instance->GetSlot(descriptor->GetGetterPropertyIndex()));
            *value = JavascriptOperators::CallGetter(func, originalInstance, requestContext);
            return true;
        }
        else
        {
            *value = instance->GetLibrary()->GetUndefined();
            return true;
        }
        return true;
    }